

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_sem.cc
# Opt level: O1

void absl::synchronization_internal::PerThreadSem::Init(ThreadIdentity *identity)

{
  Waiter::Waiter((Waiter *)&identity->waiter_state);
  (identity->ticker).super___atomic_base<int>._M_i = 0;
  (identity->wait_start).super___atomic_base<int>._M_i = 0;
  (identity->is_idle)._M_base._M_i = false;
  return;
}

Assistant:

void PerThreadSem::Init(base_internal::ThreadIdentity *identity) {
  new (Waiter::GetWaiter(identity)) Waiter();
  identity->ticker.store(0, std::memory_order_relaxed);
  identity->wait_start.store(0, std::memory_order_relaxed);
  identity->is_idle.store(false, std::memory_order_relaxed);
}